

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::join(CBString *this,CBStringList *l,uchar sep)

{
  const_reference pvVar1;
  CBStringException *pCVar2;
  ulong uVar3;
  int len;
  allocator local_b9;
  CBStringException bstr__cppwrapper_exception;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->super_tagbstring).mlen < 1) {
    std::__cxx11::string::string((string *)&local_50,"CBString::Write protection error",&local_b9);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  len = 1;
  uVar3 = 0;
  do {
    if ((ulong)((*(long *)(l + 8) - *(long *)l) / 0x18) <= uVar3) {
      alloc(this,len);
      (this->super_tagbstring).slen = 0;
      if ((this->super_tagbstring).data != (uchar *)0x0) {
        for (uVar3 = 0; uVar3 < (ulong)((*(long *)(l + 8) - *(long *)l) / 0x18); uVar3 = uVar3 + 1)
        {
          if (uVar3 != 0) {
            operator+=(this,sep);
          }
          pvVar1 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                             ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,
                              uVar3);
          operator+=(this,pvVar1);
        }
        return;
      }
      (this->super_tagbstring).mlen = 0;
      std::__cxx11::string::string
                ((string *)&local_90,"CBString::Failure in (CBStringList) constructor",&local_b9);
      CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
      __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    pvVar1 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                       ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,uVar3);
    len = len + (pvVar1->super_tagbstring).slen + 1;
    uVar3 = uVar3 + 1;
  } while (0 < len);
  std::__cxx11::string::string
            ((string *)&local_70,"CBString::Failure in (CBStringList) constructor, too long",
             &local_b9);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::join (const struct CBStringList& l, unsigned char sep) {
int c;
size_t i;

	if (mlen <= 0) {
		bstringThrow ("Write protection error");
	}

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen + 1;
		if (c <= 0) bstringThrow ("Failure in (CBStringList) constructor, too long");
	}

	alloc (c);
	slen = 0;
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			if (i > 0) *this += sep;
			*this += l.at(i);
		}
	}
}